

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_anomaly_test.cc
# Opt level: O2

void write_failure_test(void)

{
  size_t *psVar1;
  size_t keylen;
  void *pvVar2;
  void *pvVar3;
  undefined8 uVar4;
  long lVar5;
  fdb_kvs_handle *pfVar6;
  fdb_status fVar7;
  int iVar8;
  anomalous_callbacks *cbs;
  ulong uVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  long lVar13;
  char *pcVar14;
  fdb_doc *pfVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  fdb_kvs_handle *pfVar19;
  long lVar20;
  size_t asStack_c050 [3];
  fdb_kvs_handle local_c038 [92];
  undefined1 local_4b0 [8];
  fdb_config fconfig;
  char metabuf [256];
  char bodybuf [256];
  char temp [256];
  undefined1 local_b0 [8];
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fail_ctx_t fail_ctx;
  fdb_file_handle *local_60;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  long local_48;
  char *local_40;
  fdb_doc *local_38;
  fdb_doc *rdoc;
  
  uVar17 = 0;
  asStack_c050[2] = 0x103fc6;
  gettimeofday((timeval *)&kvs_config.custom_cmp_param,(__timezone_ptr_t)0x0);
  asStack_c050[2] = 0x103fcb;
  memleak_start();
  asStack_c050[2] = 0x103fd0;
  cbs = get_default_anon_cbs();
  __test_begin.tv_usec = 0;
  cbs->pwrite_cb = pwrite_failure_cb;
  asStack_c050[2] = 0x103ff6;
  system("rm -rf  anomaly_test* > errorlog.txt");
  asStack_c050[2] = 0x104001;
  filemgr_ops_anomalous_init(cbs,&__test_begin.tv_usec);
  asStack_c050[2] = 0x104017;
  fdb_get_default_config();
  asStack_c050[2] = 0x104026;
  fdb_get_default_kvs_config();
  fconfig.chunksize = 0;
  fconfig._2_2_ = 0;
  fconfig.blocksize = 0;
  fconfig.purging_interval = 1;
  fconfig.wal_threshold._4_4_ = 0;
  fconfig.flags._3_1_ = 0;
  lVar5 = -((long)(int)(local_4b0._4_4_ - 0x100) + 0xfU & 0xfffffffffffffff0);
  local_40 = (char *)((long)local_c038 + lVar5);
  *(undefined8 *)((long)local_c038 + lVar5 + -8) = 0x104075;
  fdb_open(&local_60,"anomaly_test1",(fdb_config *)local_4b0);
  *(undefined8 *)((long)local_c038 + lVar5 + -8) = 0x104085;
  fdb_kvs_open_default(local_60,(fdb_kvs_handle **)&dbfile,(fdb_kvs_config *)local_b0);
  uVar18 = local_4b0._4_4_ - 0x101;
  uVar9 = 0;
  if (0 < (int)uVar18) {
    uVar9 = (ulong)uVar18;
  }
  for (; uVar9 != uVar17; uVar17 = uVar17 + 1) {
    local_40[uVar17] = '_';
  }
  local_40[(int)uVar18] = '\0';
  pfVar19 = local_c038;
  local_48 = 0;
  for (lVar13 = 0; lVar13 != 300; lVar13 = lVar13 + 1) {
    *(undefined8 *)((long)local_c038 + lVar5 + -8) = 0x1040f1;
    sprintf(bodybuf + 0xf8,"%08d");
    *(undefined8 *)local_40 = bodybuf._248_8_;
    db = pfVar19;
    for (uVar9 = 0; uVar9 != 0x14; uVar9 = uVar9 + 1) {
      *(undefined8 *)((long)local_c038 + lVar5 + -8) = 0x10412c;
      sprintf(bodybuf + 0xf8,"%08d",uVar9 & 0xffffffff);
      pcVar14 = local_40;
      *(undefined8 *)(local_40 + (long)(int)uVar18 + -8) = bodybuf._248_8_;
      uVar16 = (int)local_48 + (int)uVar9;
      *(undefined8 *)((long)local_c038 + lVar5 + -8) = 0x104163;
      sprintf((char *)&fconfig.num_blocks_readahead,"meta%d",(ulong)uVar16);
      *(undefined8 *)((long)local_c038 + lVar5 + -8) = 0x10417e;
      sprintf(metabuf + 0xf8,"body%d",(ulong)uVar16);
      *(undefined8 *)((long)local_c038 + lVar5 + -8) = 0x104186;
      sVar10 = strlen(pcVar14);
      *(undefined8 *)((long)local_c038 + lVar5 + -8) = 0x104192;
      sVar11 = strlen((char *)&fconfig.num_blocks_readahead);
      *(undefined8 *)((long)local_c038 + lVar5 + -8) = 0x10419e;
      sVar12 = strlen(metabuf + 0xf8);
      pfVar6 = db;
      *(size_t *)((long)asStack_c050 + lVar5 + 8) = sVar12 + 1;
      *(undefined8 *)((long)asStack_c050 + lVar5) = 0x1041c9;
      fdb_doc_create((fdb_doc **)db,pcVar14,sVar10 + 1,&fconfig.num_blocks_readahead,sVar11 + 1,
                     metabuf + 0xf8,*(size_t *)((long)asStack_c050 + lVar5 + 8));
      db = (fdb_kvs_handle *)&(pfVar6->kvs_config).custom_cmp;
    }
    pfVar19 = (fdb_kvs_handle *)&(pfVar19->config).compaction_minimum_filesize;
    local_48 = local_48 + 0x14;
  }
  for (lVar13 = 0; lVar13 != 6000; lVar13 = lVar13 + 1) {
    pfVar15 = *(fdb_doc **)(&local_c038[0].kvs_config.create_if_missing + lVar13 * 8);
    *(undefined8 *)((long)local_c038 + lVar5 + -8) = 0x104213;
    fdb_set((fdb_kvs_handle *)dbfile,pfVar15);
  }
  *(undefined8 *)((long)local_c038 + lVar5 + -8) = 1;
  uVar4 = *(undefined8 *)((long)local_c038 + lVar5 + -8);
  *(undefined8 *)((long)local_c038 + lVar5 + -8) = 0x104224;
  fdb_commit(local_60,(fdb_commit_opt_t)uVar4);
  lVar13 = 0;
  while( true ) {
    if (lVar13 == 6000) {
      *(undefined8 *)((long)local_c038 + lVar5 + -8) = 0x1044aa;
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0xa3);
      write_failure_test()::__test_pass = 1;
      *(undefined8 *)((long)local_c038 + lVar5 + -8) = 0x1044cc;
      __assert_fail("anomaly_hit",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                    ,0xa3,"void write_failure_test()");
    }
    psVar1 = *(size_t **)(&local_c038[0].kvs_config.create_if_missing + lVar13 * 8);
    keylen = *psVar1;
    pvVar2 = (void *)psVar1[4];
    *(undefined8 *)((long)asStack_c050 + lVar5 + 8) = 0;
    *(undefined8 *)((long)asStack_c050 + lVar5) = 0x104264;
    fdb_doc_create(&local_38,pvVar2,keylen,(void *)0x0,0,(void *)0x0,
                   *(size_t *)((long)asStack_c050 + lVar5 + 8));
    *(undefined8 *)((long)local_c038 + lVar5 + -8) = 0x104273;
    fVar7 = fdb_get((fdb_kvs_handle *)dbfile,local_38);
    pfVar15 = local_38;
    if (fVar7 != FDB_RESULT_SUCCESS) break;
    sVar10 = local_38->keylen;
    pvVar2 = local_38->key;
    lVar20 = *(long *)(&local_c038[0].kvs_config.create_if_missing + lVar13 * 8);
    pvVar3 = *(void **)(lVar20 + 0x20);
    *(undefined8 *)((long)local_c038 + lVar5 + -8) = 0x104299;
    iVar8 = bcmp(pvVar2,pvVar3,sVar10);
    if (iVar8 != 0) {
      *(undefined8 *)((long)local_c038 + lVar5 + -8) = 0x1042ff;
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
             );
      pfVar15 = local_38;
      write_failure_test()::__test_pass = '\x01';
      sVar10 = local_38->keylen;
      pvVar2 = local_38->key;
      lVar20 = *(long *)(&local_c038[0].kvs_config.create_if_missing + lVar13 * 8);
      pvVar3 = *(void **)(lVar20 + 0x20);
      *(undefined8 *)((long)local_c038 + lVar5 + -8) = 0x104324;
      iVar8 = bcmp(pvVar2,pvVar3,sVar10);
      if (iVar8 != 0) {
        *(undefined8 *)((long)local_c038 + lVar5 + -8) = 0x1044eb;
        __assert_fail("!memcmp(rdoc->key, doc[i]->key, rdoc->keylen)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                      ,0x9e,"void write_failure_test()");
      }
    }
    sVar10 = pfVar15->metalen;
    pvVar2 = pfVar15->meta;
    pvVar3 = *(void **)(lVar20 + 0x38);
    *(undefined8 *)((long)local_c038 + lVar5 + -8) = 0x1042b0;
    iVar8 = bcmp(pvVar2,pvVar3,sVar10);
    if (iVar8 != 0) {
      *(undefined8 *)((long)local_c038 + lVar5 + -8) = 0x104351;
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
             );
      pfVar15 = local_38;
      write_failure_test()::__test_pass = '\x01';
      sVar10 = local_38->metalen;
      pvVar2 = local_38->meta;
      lVar20 = *(long *)(&local_c038[0].kvs_config.create_if_missing + lVar13 * 8);
      pvVar3 = *(void **)(lVar20 + 0x38);
      *(undefined8 *)((long)local_c038 + lVar5 + -8) = 0x104377;
      iVar8 = bcmp(pvVar2,pvVar3,sVar10);
      if (iVar8 != 0) {
        *(code **)((long)local_c038 + lVar5 + -8) = pread_failure_cb;
        __assert_fail("!memcmp(rdoc->meta, doc[i]->meta, rdoc->metalen)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                      ,0x9f,"void write_failure_test()");
      }
    }
    sVar10 = pfVar15->bodylen;
    pvVar2 = pfVar15->body;
    pvVar3 = *(void **)(lVar20 + 0x40);
    *(undefined8 *)((long)local_c038 + lVar5 + -8) = 0x1042c7;
    iVar8 = bcmp(pvVar2,pvVar3,sVar10);
    if (iVar8 != 0) {
      *(undefined8 *)((long)local_c038 + lVar5 + -8) = 0x1043a4;
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
             );
      pfVar15 = local_38;
      write_failure_test()::__test_pass = '\x01';
      sVar10 = local_38->bodylen;
      pvVar2 = local_38->body;
      pvVar3 = *(void **)(*(long *)(&local_c038[0].kvs_config.create_if_missing + lVar13 * 8) + 0x40
                         );
      *(undefined8 *)((long)local_c038 + lVar5 + -8) = 0x1043ca;
      iVar8 = bcmp(pvVar2,pvVar3,sVar10);
      if (iVar8 != 0) {
        *(undefined8 *)((long)local_c038 + lVar5 + -8) = 0x1043f1;
        __assert_fail("!memcmp(rdoc->body, doc[i]->body, rdoc->bodylen)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                      ,0xa0,"void write_failure_test()");
      }
    }
    *(undefined8 *)((long)local_c038 + lVar5 + -8) = 0x1042d7;
    fdb_doc_free(pfVar15);
    lVar13 = lVar13 + 1;
  }
  *(undefined8 *)((long)local_c038 + lVar5 + -8) = 0x1043f9;
  fdb_doc_free(local_38);
  *(undefined8 *)((long)local_c038 + lVar5 + -8) = 0x104402;
  fdb_close(local_60);
  for (lVar13 = 0; lVar13 != 6000; lVar13 = lVar13 + 1) {
    pfVar15 = *(fdb_doc **)(&local_c038[0].kvs_config.create_if_missing + lVar13 * 8);
    *(undefined8 *)((long)local_c038 + lVar5 + -8) = 0x10441a;
    fdb_doc_free(pfVar15);
  }
  *(undefined8 *)((long)local_c038 + lVar5 + -8) = 0x104424;
  fdb_shutdown();
  *(undefined8 *)((long)local_c038 + lVar5 + -8) = 0x104429;
  memleak_end();
  *(undefined8 *)((long)local_c038 + lVar5 + -8) = 0x104447;
  sprintf(bodybuf + 0xf8,"write failure test: %d failures out of %d writes",
          __test_begin.tv_usec & 0xffffffff,(ulong)__test_begin.tv_usec >> 0x20);
  pcVar14 = "%s PASSED\n";
  if (write_failure_test()::__test_pass != '\0') {
    pcVar14 = "%s FAILED\n";
  }
  *(undefined8 *)((long)local_c038 + lVar5 + -8) = 0x104474;
  fprintf(_stderr,pcVar14,bodybuf + 0xf8);
  return;
}

Assistant:

void write_failure_test()
{
    TEST_INIT();

    memleak_start();

    int i, j, idx, r;
    int n=300, m=20; // n: # prefixes, m: # postfixes
    int keylen_limit;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n*m);
    fdb_doc *rdoc;
    fdb_status status;
    int anomaly_hit = 0;

    char *keybuf;
    char metabuf[256], bodybuf[256], temp[256];
    // Get the default callbacks which result in normal operation for other ops
    struct anomalous_callbacks *write_fail_cb = get_default_anon_cbs();
    fail_ctx_t fail_ctx;
    memset(&fail_ctx, 0, sizeof(fail_ctx_t));
    // Modify the pwrite callback to redirect to test-specific function
    write_fail_cb->pwrite_cb = &pwrite_failure_cb;

    // remove previous anomaly_test files
    r = system(SHELL_DEL" anomaly_test* > errorlog.txt");
    (void)r;

    // Reset anomalous behavior stats..
    filemgr_ops_anomalous_init(write_fail_cb, &fail_ctx);

    // The number indicates the count after which all writes begin to fail
    // This number is unique to this test suite and can cause a segmentation
    // fault if the underlying fixed issue resurfaces
    fail_ctx.start_failing_after = 10112;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 0;
    fconfig.compaction_threshold = 0;

    keylen_limit = fconfig.blocksize - 256;
    keybuf = alca(char, keylen_limit);

    // open db
    fdb_open(&dbfile, "anomaly_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);

    // key structure:
    // <------------ <keylen_limit> bytes ------------->
    // <-- 8 bytes -->             <-- 8 bytes  -->< 1 >
    // [prefix number]____ ... ____[postfix number][ \0]
    // e.g.)
    // 00000001____ ... ____00000013[\0]

    // create docs
    for (i=0;i<keylen_limit-1;++i){
        keybuf[i] = '_';
    }
    keybuf[keylen_limit-1] = 0;

    for (i=0;i<n;++i){
        // set prefix
        sprintf(temp, "%08d", i);
        memcpy(keybuf, temp, 8);
        for (j=0;j<m;++j){
            idx = i*m + j;
            // set postfix
            sprintf(temp, "%08d", j);
            memcpy(keybuf + (keylen_limit-1) - 8, temp, 8);
            sprintf(metabuf, "meta%d", idx);
            sprintf(bodybuf, "body%d", idx);
            fdb_doc_create(&doc[idx], (void*)keybuf, strlen(keybuf)+1,
                                    (void*)metabuf, strlen(metabuf)+1,
                                    (void*)bodybuf, strlen(bodybuf)+1);
        }
    }

    // insert docs
    for (i=0;i<n*m;++i) {
        fdb_set(db, doc[i]);
    }
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // retrieval check
    for (i=0;i<n*m;++i){
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        if (status != FDB_RESULT_SUCCESS) {
            fdb_doc_free(rdoc);
            anomaly_hit = 1;
            break;
        }
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(!memcmp(rdoc->key, doc[i]->key, rdoc->keylen));
        TEST_CHK(!memcmp(rdoc->meta, doc[i]->meta, rdoc->metalen));
        TEST_CHK(!memcmp(rdoc->body, doc[i]->body, rdoc->bodylen));
        fdb_doc_free(rdoc);
    }
    TEST_CHK(anomaly_hit);

    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n*m;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    sprintf(temp, "write failure test: %d failures out of %d writes",
            fail_ctx.num_fails, fail_ctx.num_ops);

    TEST_RESULT(temp);
}